

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O2

void ot::commissioner::persistent_storage::from_json(json *aJson,Network *aValue)

{
  undefined4 uVar1;
  uint uVar2;
  const_reference pvVar3;
  JsonException *pJVar4;
  string hexStr;
  undefined1 local_98 [40];
  Error local_70;
  Error local_48;
  
  hexStr._M_dataplus._M_p = (pointer)&hexStr.field_2;
  hexStr._M_string_length = 0;
  hexStr.field_2._M_local_buf[0] = '\0';
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  uVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_int,_unsigned_int,_0>(pvVar3);
  (aValue->mId).mId = uVar2;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_DOM_REF_abi_cxx11_);
  uVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_int,_unsigned_int,_0>(pvVar3);
  (aValue->mDomainId).mId = uVar2;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_NAME_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&aValue->mName);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_PAN_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&hexStr);
  utils::ParseInteger<unsigned_short>((Error *)local_98,&aValue->mPan,&hexStr);
  uVar1 = local_98._0_4_;
  std::__cxx11::string::~string((string *)(local_98 + 8));
  if (uVar1 != kNone) {
    pJVar4 = (JsonException *)__cxa_allocate_exception(0x38);
    utils::ParseInteger<unsigned_short>(&local_48,&aValue->mPan,&hexStr);
    anon_unknown_0::JsonException::JsonException(pJVar4,&local_48);
    __cxa_throw(pJVar4,&(anonymous_namespace)::JsonException::typeinfo,
                anon_unknown_0::JsonException::~JsonException);
  }
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_XPAN_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&hexStr);
  utils::ParseInteger<unsigned_long>((Error *)local_98,&aValue->mXpan,&hexStr);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  if (local_98._0_4_ == kNone) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CHANNEL_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
              (pvVar3,&aValue->mChannel);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_MLP_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar3,&aValue->mMlp);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CCM_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,&aValue->mCcm);
    std::__cxx11::string::~string((string *)&hexStr);
    return;
  }
  pJVar4 = (JsonException *)__cxa_allocate_exception(0x38);
  utils::ParseInteger<unsigned_long>(&local_70,&aValue->mXpan,&hexStr);
  anon_unknown_0::JsonException::JsonException(pJVar4,&local_70);
  __cxa_throw(pJVar4,&(anonymous_namespace)::JsonException::typeinfo,
              anon_unknown_0::JsonException::~JsonException);
}

Assistant:

void from_json(const json &aJson, Network &aValue)
{
    std::string hexStr;

    aJson.at(JSON_ID).get_to(aValue.mId);
    aJson.at(JSON_DOM_REF).get_to(aValue.mDomainId);
    aJson.at(JSON_NAME).get_to(aValue.mName);

    aJson.at(JSON_PAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mPan, hexStr));
    aJson.at(JSON_XPAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mXpan, hexStr));

    aJson.at(JSON_CHANNEL).get_to(aValue.mChannel);
    aJson.at(JSON_MLP).get_to(aValue.mMlp);
    aJson.at(JSON_CCM).get_to(aValue.mCcm);
}